

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O3

int __thiscall zmq::msg_t::init_join(msg_t *this)

{
  (this->_u).base.metadata = (metadata_t *)0x0;
  (this->_u).base.type = 'j';
  *(undefined4 *)((long)&this->_u + 0x2b) = 0;
  *(undefined4 *)((long)&(this->_u).base.routing_id + 2) = 0;
  return 0;
}

Assistant:

int zmq::msg_t::init_join ()
{
    _u.base.metadata = NULL;
    _u.base.type = type_join;
    _u.base.flags = 0;
    _u.base.group.sgroup.group[0] = '\0';
    _u.base.group.type = group_type_short;
    _u.base.routing_id = 0;
    return 0;
}